

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi.cpp
# Opt level: O2

int adl_getNextBank(ADL_MIDIPlayer *device,ADL_Bank *bank)

{
  long lVar1;
  iterator *piVar2;
  iterator it;
  
  if (device != (ADL_MIDIPlayer *)0x0) {
    if (device->adl_midiPlayer == (void *)0x0) {
      __assert_fail("play",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libADLMIDI/src/adlmidi.cpp"
                    ,0x161,"int adl_getNextBank(ADL_MIDIPlayer *, ADL_Bank *)");
    }
    lVar1 = *(long *)((long)device->adl_midiPlayer + 0x198);
    it.buckets = (Slot **)bank->pointer[0];
    it.slot = (Slot *)bank->pointer[1];
    it.index = (size_t)bank->pointer[2];
    piVar2 = BasicBankMap<OPL3::Bank>::iterator::operator++(&it);
    if (((piVar2->buckets != *(Slot ***)(lVar1 + 0xa0)) || (piVar2->slot != (Slot *)0x0)) ||
       (piVar2->index != 0x100)) {
      bank->pointer[0] = it.buckets;
      bank->pointer[1] = it.slot;
      bank->pointer[2] = (void *)it.index;
      return 0;
    }
  }
  return -1;
}

Assistant:

ADLMIDI_EXPORT int adl_getNextBank(ADL_MIDIPlayer *device, ADL_Bank *bank)
{
    if(!device)
        return -1;

    MidiPlayer *play = GET_MIDI_PLAYER(device);
    assert(play);
    Synth::BankMap &map = play->m_synth->m_insBanks;

    Synth::BankMap::iterator it = Synth::BankMap::iterator::from_ptrs(bank->pointer);
    if(++it == map.end())
        return -1;

    it.to_ptrs(bank->pointer);
    return 0;
}